

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  FILE *__stream;
  int iVar10;
  char *__format;
  ulong uVar11;
  int local_894;
  glob_t globbuf;
  char prefix [500];
  char result [500];
  char err [500];
  char pattern [500];
  
  pcVar4 = baseFilename(filename);
  uVar5 = xmlSchemaNewParserCtxt(filename);
  xmlSchemaSetParserErrors(uVar5,testErrorHandler,testErrorHandler,uVar5);
  lVar6 = xmlSchemaParse(uVar5);
  xmlSchemaFreeParserCtxt(uVar5);
  iVar2 = testErrorsSize;
  sVar7 = strlen(pcVar4);
  iVar3 = (int)sVar7;
  if (iVar3 - 500U < 0xfffffe11) {
    xmlSchemaFree(lVar6);
    local_894 = -1;
  }
  else {
    iVar10 = iVar3 + -6;
    if (pcVar4[(long)iVar3 + -6] != '_') {
      iVar10 = iVar3 + -4;
    }
    if (pcVar4[(long)iVar10 + -2] == '_') {
      iVar10 = iVar10 + -2;
    }
    sVar7 = (size_t)iVar10;
    memcpy(prefix,pcVar4,sVar7);
    prefix[sVar7] = '\0';
    iVar3 = snprintf(pattern,499,"./test/schemas/%s_*.xml",prefix);
    if (0x1f2 < iVar3) {
      pattern[499] = '\0';
    }
    if (pcVar4[sVar7] == '_') {
      memcpy(prefix,pcVar4,sVar7 + 2);
      prefix[sVar7 + 2] = '\0';
    }
    globbuf.gl_offs = 0;
    glob64(pattern,8,(__errfunc *)0x0,(glob64_t *)&globbuf);
    local_894 = 0;
    for (uVar11 = 0; uVar11 < globbuf.gl_pathc; uVar11 = uVar11 + 1) {
      testErrorsSize = iVar2;
      testErrors[iVar2] = '\0';
      pcVar4 = globbuf.gl_pathv[uVar11];
      pcVar8 = baseFilename(pcVar4);
      sVar7 = strlen(pcVar8);
      iVar3 = (int)sVar7;
      if ((iVar3 < 7) || (pcVar8[iVar3 - 6] != '_')) {
        fprintf(_stderr,"don\'t know how to process %s\n",pcVar4);
      }
      else {
        cVar1 = pcVar8[iVar3 - 5];
        iVar3 = snprintf(result,499,"result/schemas/%s_%c",prefix,(ulong)(uint)(int)cVar1);
        if (0x1f2 < iVar3) {
          result[499] = '\0';
        }
        iVar3 = snprintf(err,499,"result/schemas/%s_%c.err",prefix,(ulong)(uint)(int)cVar1);
        if (0x1f2 < iVar3) {
          err[499] = '\0';
        }
        if (lVar6 != 0) {
          nb_tests = nb_tests + 1;
          lVar9 = xmlReadFile(pcVar4,0,options);
          if (lVar9 == 0) {
            fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar4,filename);
            local_894 = -1;
          }
          else {
            pcVar8 = resultFilename(result,temp_directory,".res");
            if (pcVar8 == (char *)0x0) {
              fwrite("Out of memory\n",0xe,1,_stderr);
              fatalError();
            }
            __stream = fopen64(pcVar8,"wb");
            if (__stream == (FILE *)0x0) {
              fprintf(_stderr,"failed to open output file %s\n",pcVar8);
              xmlFreeDoc(lVar9);
              free(pcVar8);
              local_894 = -1;
            }
            else {
              uVar5 = xmlSchemaNewValidCtxt(lVar6);
              xmlSchemaSetValidErrors(uVar5,testErrorHandler,testErrorHandler,uVar5);
              iVar3 = xmlSchemaValidateDoc(uVar5,lVar9);
              __format = "%s validation generated an internal error\n";
              if (0 < iVar3) {
                __format = "%s fails to validate\n";
              }
              if (iVar3 == 0) {
                __format = "%s validates\n";
              }
              fprintf(__stream,__format,pcVar4);
              fclose(__stream);
              iVar3 = compareFiles(pcVar8,result);
              if (iVar3 != 0) {
                fprintf(_stderr,"Result for %s on %s failed\n",pcVar4,filename);
                local_894 = 1;
              }
              unlink(pcVar8);
              free(pcVar8);
              xmlSchemaFreeValidCtxt(uVar5);
              xmlFreeDoc(lVar9);
            }
          }
        }
        iVar3 = compareFileMem(err,testErrors,testErrorsSize);
        if (iVar3 != 0) {
          fprintf(_stderr,"Error for %s on %s failed\n",pcVar4,filename);
          local_894 = 1;
        }
      }
    }
    globfree64((glob64_t *)&globbuf);
    xmlSchemaFree(lVar6);
  }
  return local_894;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    int parseErrorsSize;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserErrors(ctxt, testErrorHandler, testErrorHandler, ctxt);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);
    parseErrorsSize = testErrorsSize;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_*.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = parseErrorsSize;
        testErrors[parseErrorsSize] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/schemas/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	if (schemas != NULL) {
	    nb_tests++;
	    ret = schemasOneTest(filename, instance, result, options, schemas);
	    if (ret != 0)
		res = ret;
	}
        if (compareFileMem(err, testErrors, testErrorsSize)) {
            fprintf(stderr, "Error for %s on %s failed\n", instance,
                    filename);
            res = 1;
        }
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}